

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O3

void __thiscall
SharedTimedMutexTest_TryLockSharedUntil_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::~SharedTimedMutexTest_TryLockSharedUntil_Test
          (SharedTimedMutexTest_TryLockSharedUntil_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(SharedTimedMutexTest, TryLockSharedUntil)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-threads
        ASSERT_NO_THROW(mtx.lock());
        ph.advance(1);  // p1
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ph.await();     // p1
        EXPECT_TRUE(mtx.try_lock_shared_until(std::chrono::system_clock::now() + TEST_NOT_TIMEOUT));
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}